

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::AddGenericFrame(Segment *this,Frame *frame)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  Track *pTVar4;
  int64_t iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  Frame *pFVar8;
  Frame *in_RSI;
  Segment *in_RDI;
  Frame *new_frame_1;
  bool frame_created;
  Cluster *cluster;
  Frame *new_frame;
  uint64_t rel_timecode;
  uint64_t last_cluster_timecode;
  Cluster *last_cluster;
  uint64_t frame_timecode;
  uint64_t timecode_scale;
  Frame *in_stack_fffffffffffffee8;
  Cluster *in_stack_fffffffffffffef0;
  Tracks *in_stack_fffffffffffffef8;
  Frame *in_stack_ffffffffffffff00;
  Segment *in_stack_ffffffffffffff08;
  Frame *in_stack_ffffffffffffff10;
  Segment *in_stack_ffffffffffffff18;
  Frame *local_e0;
  Frame *local_b0;
  Tracks *in_stack_ffffffffffffff58;
  Tracks *timestamp;
  Frame *local_18;
  bool local_1;
  
  if (in_RSI == (Frame *)0x0) {
    local_1 = false;
  }
  else {
    bVar1 = CheckHeaderInfo(in_stack_ffffffffffffff18);
    if (bVar1) {
      uVar3 = Frame::timestamp(in_RSI);
      if (uVar3 < in_RDI->last_timestamp_) {
        local_1 = false;
      }
      else {
        timestamp = &in_RDI->tracks_;
        Frame::track_number(in_RSI);
        pTVar4 = Tracks::GetTrackByNumber
                           (in_stack_fffffffffffffef8,(uint64_t)in_stack_fffffffffffffef0);
        if (pTVar4 == (Track *)0x0) {
          local_1 = false;
        }
        else {
          iVar5 = Frame::discard_padding(in_RSI);
          if (iVar5 != 0) {
            in_RDI->doc_type_version_ = 4;
          }
          if (0 < in_RDI->cluster_list_size_) {
            uVar3 = SegmentInfo::timecode_scale(&in_RDI->segment_info_);
            uVar6 = Frame::timestamp(in_RSI);
            uVar7 = Cluster::timecode(in_RDI->cluster_list_[in_RDI->cluster_list_size_ + -1]);
            if (0x7fff < uVar6 / uVar3 - uVar7) {
              in_RDI->force_new_cluster_ = true;
            }
          }
          if ((in_RDI->has_video_ & 1U) != 0) {
            in_stack_ffffffffffffff58 = &in_RDI->tracks_;
            Frame::track_number(in_RSI);
            bVar1 = Tracks::TrackIsAudio
                              (in_stack_fffffffffffffef8,(uint64_t)in_stack_fffffffffffffef0);
            if ((bVar1) && ((in_RDI->force_new_cluster_ & 1U) == 0)) {
              pFVar8 = (Frame *)operator_new(0x68,(nothrow_t *)&std::nothrow);
              local_b0 = (Frame *)0x0;
              if (pFVar8 != (Frame *)0x0) {
                Frame::Frame(pFVar8);
                local_b0 = pFVar8;
              }
              if ((local_b0 != (Frame *)0x0) &&
                 (bVar1 = Frame::CopyFrom((Frame *)in_stack_ffffffffffffff18,
                                          in_stack_ffffffffffffff10), bVar1)) {
                bVar1 = QueueFrame(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
                if (!bVar1) {
                  if (local_b0 != (Frame *)0x0) {
                    Frame::~Frame(in_stack_ffffffffffffff00);
                    operator_delete(local_b0);
                  }
                  return false;
                }
                uVar3 = Frame::track_number(in_RSI);
                in_RDI->track_frames_written_[uVar3 - 1] =
                     in_RDI->track_frames_written_[uVar3 - 1] + 1;
                return true;
              }
              if (local_b0 != (Frame *)0x0) {
                Frame::~Frame(in_stack_ffffffffffffff00);
                operator_delete(local_b0);
              }
              return false;
            }
          }
          Frame::track_number(in_RSI);
          Frame::timestamp(in_RSI);
          Frame::is_key(in_RSI);
          bVar1 = DoNewClusterProcessing
                            (in_stack_ffffffffffffff08,(uint64_t)in_stack_ffffffffffffff00,
                             (uint64_t)in_stack_fffffffffffffef8,
                             SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
          if (bVar1) {
            if (in_RDI->cluster_list_size_ < 1) {
              local_1 = false;
            }
            else if (in_RDI->cluster_list_[in_RDI->cluster_list_size_ + -1] == (Cluster *)0x0) {
              local_1 = false;
            }
            else {
              bVar1 = false;
              bVar2 = Frame::CanBeSimpleBlock(in_RSI);
              local_18 = in_RSI;
              if (((!bVar2) && (bVar2 = Frame::is_key(in_RSI), !bVar2)) &&
                 (bVar2 = Frame::reference_block_timestamp_set(in_RSI), !bVar2)) {
                pFVar8 = (Frame *)operator_new(0x68,(nothrow_t *)&std::nothrow);
                local_e0 = (Frame *)0x0;
                if (pFVar8 != (Frame *)0x0) {
                  Frame::Frame(pFVar8);
                  local_e0 = pFVar8;
                }
                if ((local_e0 == (Frame *)0x0) ||
                   (bVar1 = Frame::CopyFrom(pFVar8,in_stack_ffffffffffffff10), !bVar1)) {
                  if (local_e0 != (Frame *)0x0) {
                    Frame::~Frame(in_stack_ffffffffffffff00);
                    operator_delete(local_e0);
                  }
                  return false;
                }
                pFVar8 = local_e0;
                uVar3 = Frame::track_number(in_RSI);
                Frame::set_reference_block_timestamp
                          (pFVar8,in_RDI->last_track_timestamp_[uVar3 - 1]);
                local_18 = local_e0;
                bVar1 = true;
              }
              bVar2 = Cluster::AddFrame(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
              if (bVar2) {
                if ((in_RDI->new_cuepoint_ & 1U) != 0) {
                  in_stack_ffffffffffffff00 = (Frame *)in_RDI->cues_track_;
                  pFVar8 = (Frame *)Frame::track_number(local_18);
                  if (in_stack_ffffffffffffff00 == pFVar8) {
                    Frame::timestamp(local_18);
                    bVar2 = AddCuePoint(in_RDI,(uint64_t)timestamp,
                                        (uint64_t)in_stack_ffffffffffffff58);
                    if (!bVar2) {
                      return false;
                    }
                  }
                }
                uVar3 = Frame::timestamp(local_18);
                in_RDI->last_timestamp_ = uVar3;
                uVar3 = Frame::timestamp(local_18);
                uVar6 = Frame::track_number(local_18);
                in_RDI->last_track_timestamp_[uVar6 - 1] = uVar3;
                uVar3 = Frame::duration(local_18);
                in_RDI->last_block_duration_ = uVar3;
                uVar3 = Frame::track_number(local_18);
                in_RDI->track_frames_written_[uVar3 - 1] =
                     in_RDI->track_frames_written_[uVar3 - 1] + 1;
                if ((bVar1) && (local_18 != (Frame *)0x0)) {
                  Frame::~Frame(in_stack_ffffffffffffff00);
                  operator_delete(local_18);
                }
                local_1 = true;
              }
              else {
                local_1 = false;
              }
            }
          }
          else {
            local_1 = false;
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Segment::AddGenericFrame(const Frame* frame) {
  if (!frame)
    return false;

  if (!CheckHeaderInfo())
    return false;

  // Check for non-monotonically increasing timestamps.
  if (frame->timestamp() < last_timestamp_)
    return false;

  // Check if the track number is valid.
  if (!tracks_.GetTrackByNumber(frame->track_number()))
    return false;

  if (frame->discard_padding() != 0)
    doc_type_version_ = 4;

  if (cluster_list_size_ > 0) {
    const uint64_t timecode_scale = segment_info_.timecode_scale();
    const uint64_t frame_timecode = frame->timestamp() / timecode_scale;

    const Cluster* const last_cluster = cluster_list_[cluster_list_size_ - 1];
    const uint64_t last_cluster_timecode = last_cluster->timecode();

    const uint64_t rel_timecode = frame_timecode - last_cluster_timecode;
    if (rel_timecode > kMaxBlockTimecode) {
      force_new_cluster_ = true;
    }
  }

  // If the segment has a video track hold onto audio frames to make sure the
  // audio that is associated with the start time of a video key-frame is
  // muxed into the same cluster.
  if (has_video_ && tracks_.TrackIsAudio(frame->track_number()) &&
      !force_new_cluster_) {
    Frame* const new_frame = new (std::nothrow) Frame();
    if (!new_frame || !new_frame->CopyFrom(*frame)) {
      delete new_frame;
      return false;
    }
    if (!QueueFrame(new_frame)) {
      delete new_frame;
      return false;
    }
    track_frames_written_[frame->track_number() - 1]++;
    return true;
  }

  if (!DoNewClusterProcessing(frame->track_number(), frame->timestamp(),
                              frame->is_key())) {
    return false;
  }

  if (cluster_list_size_ < 1)
    return false;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  // If the Frame is not a SimpleBlock, then set the reference_block_timestamp
  // if it is not set already.
  bool frame_created = false;
  if (!frame->CanBeSimpleBlock() && !frame->is_key() &&
      !frame->reference_block_timestamp_set()) {
    Frame* const new_frame = new (std::nothrow) Frame();
    if (!new_frame || !new_frame->CopyFrom(*frame)) {
      delete new_frame;
      return false;
    }
    new_frame->set_reference_block_timestamp(
        last_track_timestamp_[frame->track_number() - 1]);
    frame = new_frame;
    frame_created = true;
  }

  if (!cluster->AddFrame(frame))
    return false;

  if (new_cuepoint_ && cues_track_ == frame->track_number()) {
    if (!AddCuePoint(frame->timestamp(), cues_track_))
      return false;
  }

  last_timestamp_ = frame->timestamp();
  last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
  last_block_duration_ = frame->duration();
  track_frames_written_[frame->track_number() - 1]++;

  if (frame_created)
    delete frame;
  return true;
}